

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QPushButton_*>::resize_impl
          (QVLABase<QPushButton_*> *this,qsizetype prealloc,void *array,qsizetype sz,QPushButton **v
          )

{
  bool bVar1;
  iterator prealloc_00;
  iterator ppQVar2;
  size_type sVar3;
  QPushButton **ppQVar4;
  long in_RCX;
  qsizetype in_RDX;
  QVLABase<QPushButton_*> *in_RSI;
  QVLABaseBase *in_RDI;
  QPushButton **in_R8;
  long in_FS_OFFSET;
  QVLABase<QPushButton_*> *in_stack_ffffffffffffff80;
  QVLABase<QPushButton_*> *in_stack_ffffffffffffffb8;
  QPushButton **args;
  QVLABaseBase *asize;
  size_type local_20;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args = in_R8;
  asize = in_RDI;
  local_10 = in_RCX;
  prealloc_00 = begin((QVLABase<QPushButton_*> *)0x673b1e);
  ppQVar2 = end(in_stack_ffffffffffffff80);
  bVar1 = QtPrivate::q_points_into_range<QPushButton*,std::less<void>>(in_R8,prealloc_00,ppQVar2);
  if (bVar1) {
    resize_impl(in_RSI,in_RDX,args,(qsizetype)*args,(QPushButton **)in_stack_ffffffffffffffb8);
  }
  else {
    local_20 = QVLABaseBase::capacity(in_RDI);
    qMax<long_long>(&local_10,&local_20);
    reallocate_impl(in_stack_ffffffffffffffb8,(qsizetype)prealloc_00,in_R8,(qsizetype)asize,
                    (qsizetype)in_RSI);
    while( true ) {
      sVar3 = QVLABaseBase::size(in_RDI);
      if (local_10 <= sVar3) break;
      ppQVar4 = data((QVLABase<QPushButton_*> *)in_RDI);
      sVar3 = QVLABaseBase::size(in_RDI);
      q20::construct_at<QPushButton*,QPushButton*const&,void>(ppQVar4 + sVar3,args);
      in_RDI->s = in_RDI->s + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz, const T &v)
    {
        if (QtPrivate::q_points_into_range(&v, begin(), end())) {
            resize_impl(prealloc, array, sz, T(v));
            return;
        }
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        while (size() < sz) {
            q20::construct_at(data() + size(), v);
            ++s;
        }
    }